

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_parse_address(char *str,socket_address *sa,int *proto,char *host,size_t host_len)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  size_t sVar4;
  ushort **ppuVar5;
  int local_58;
  int local_54;
  int local_50;
  int len;
  int ch;
  uint port;
  uint d;
  uint c;
  uint b;
  uint a;
  size_t host_len_local;
  char *host_local;
  int *proto_local;
  socket_address *sa_local;
  char *str_local;
  
  len = 0;
  local_54 = 0;
  _b = host_len;
  host_len_local = (size_t)host;
  host_local = (char *)proto;
  proto_local = (int *)sa;
  sa_local = (socket_address *)str;
  memset(sa,0,0x10);
  *(undefined2 *)proto_local = 2;
  host_local[0] = '\x01';
  host_local[1] = '\0';
  host_local[2] = '\0';
  host_local[3] = '\0';
  iVar2 = strncmp((char *)sa_local,"udp://",6);
  if (iVar2 == 0) {
    sa_local = (socket_address *)((sa_local->sa).sa_data + 4);
    host_local[0] = '\x02';
    host_local[1] = '\0';
    host_local[2] = '\0';
    host_local[3] = '\0';
  }
  else {
    iVar2 = strncmp((char *)sa_local,"tcp://",6);
    if (iVar2 == 0) {
      sa_local = (socket_address *)((sa_local->sa).sa_data + 4);
    }
  }
  iVar2 = __isoc99_sscanf(sa_local,"%u.%u.%u.%u:%u%n",&c,&d,&port,&ch,&len,&local_54);
  if (iVar2 == 5) {
    uVar3 = htonl(c << 0x18 | d << 0x10 | port << 8 | ch);
    proto_local[1] = uVar3;
    uVar1 = htons((uint16_t)len);
    *(uint16_t *)((long)proto_local + 2) = uVar1;
  }
  else {
    sVar4 = strlen((char *)sa_local);
    if ((sVar4 < _b) &&
       (iVar2 = __isoc99_sscanf(sa_local,"%[^ :]:%u%n",host_len_local,&len,&local_54), iVar2 == 2))
    {
      uVar1 = htons((uint16_t)len);
      *(uint16_t *)((long)proto_local + 2) = uVar1;
      iVar2 = mg_resolve_from_hosts_file((char *)host_len_local,(socket_address *)proto_local);
      if (iVar2 != 0) {
        return 0;
      }
    }
    else {
      iVar2 = __isoc99_sscanf(sa_local,":%u%n",&len,&local_54);
      if ((iVar2 != 1) && (iVar2 = __isoc99_sscanf(sa_local,"%u%n",&len,&local_54), iVar2 != 1)) {
        return -1;
      }
      uVar1 = htons((uint16_t)len);
      *(uint16_t *)((long)proto_local + 2) = uVar1;
    }
  }
  local_50 = (int)*(char *)((long)sa_local + (long)local_54);
  if (((uint)len < 0xffff) &&
     (((local_50 == 0 || (local_50 == 0x2c)) ||
      (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[local_50] & 0x2000) != 0)))) {
    local_58 = local_54;
  }
  else {
    local_58 = -1;
  }
  return local_58;
}

Assistant:

MG_INTERNAL int mg_parse_address(const char *str, union socket_address *sa,
                                 int *proto, char *host, size_t host_len) {
    unsigned int a, b, c, d, port = 0;
    int ch, len = 0;
#ifdef MG_ENABLE_IPV6
    char buf[100];
#endif

    /*
   * MacOS needs that. If we do not zero it, subsequent bind() will fail.
   * Also, all-zeroes in the socket address means binding to all addresses
   * for both IPv4 and IPv6 (INADDR_ANY and IN6ADDR_ANY_INIT).
   */
    memset(sa, 0, sizeof(*sa));
    sa->sin.sin_family = AF_INET;

    *proto = SOCK_STREAM;

    if (strncmp(str, "udp://", 6) == 0) {
        str += 6;
        *proto = SOCK_DGRAM;
    } else if (strncmp(str, "tcp://", 6) == 0) {
        str += 6;
    }

    if (sscanf(str, "%u.%u.%u.%u:%u%n", &a, &b, &c, &d, &port, &len) == 5) {
        /* Bind to a specific IPv4 address, e.g. 192.168.1.5:8080 */
        sa->sin.sin_addr.s_addr =
                htonl(((uint32_t) a << 24) | ((uint32_t) b << 16) | c << 8 | d);
        sa->sin.sin_port = htons((uint16_t) port);
#ifdef MG_ENABLE_IPV6
                                                                                                                                } else if (sscanf(str, "[%99[^]]]:%u%n", buf, &port, &len) == 2 &&
             inet_pton(AF_INET6, buf, &sa->sin6.sin6_addr)) {
    /* IPv6 address, e.g. [3ffe:2a00:100:7031::1]:8080 */
    sa->sin6.sin6_family = AF_INET6;
    sa->sin.sin_port = htons((uint16_t) port);
#endif
#ifndef MG_DISABLE_RESOLVER
    } else if (strlen(str) < host_len &&
               sscanf(str, "%[^ :]:%u%n", host, &port, &len) == 2) {
        sa->sin.sin_port = htons((uint16_t) port);
        if (mg_resolve_from_hosts_file(host, sa) != 0) {
            return 0;
        }
#endif
    } else if (sscanf(str, ":%u%n", &port, &len) == 1 ||
               sscanf(str, "%u%n", &port, &len) == 1) {
        /* If only port is specified, bind to IPv4, INADDR_ANY */
        sa->sin.sin_port = htons((uint16_t) port);
    } else {
        return -1;
    }

    ch = str[len]; /* Character that follows the address */
    return port < 0xffffUL && (ch == '\0' || ch == ',' || isspace(ch)) ? len : -1;
}